

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

ID __thiscall Fl_Plugin_Manager::addPlugin(Fl_Plugin_Manager *this,char *name,Fl_Plugin *plugin)

{
  byte bVar1;
  Node *pNVar2;
  long lVar3;
  anon_union_8_2_7f9ed1a6 v;
  Fl_Preferences pin;
  char buf [34];
  undefined8 uStack_60;
  Fl_Plugin *local_58;
  Fl_Preferences local_50;
  char local_38 [40];
  
  local_50._vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
  local_50.rootNode = (this->super_Fl_Preferences).rootNode;
  uStack_60 = 0x1c642c;
  pNVar2 = Fl_Preferences::Node::addChild((this->super_Fl_Preferences).node,name);
  local_38[0] = '@';
  local_58 = plugin;
  lVar3 = 1;
  do {
    bVar1 = *(byte *)((long)&uStack_60 + lVar3 + 7);
    local_38[lVar3 * 2 + -1] = (bVar1 >> 4) + 0x41;
    local_38[lVar3 * 2] = (bVar1 & 0xf) + 0x41;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  local_38[0x11] = 0;
  uStack_60 = 0x1c6482;
  local_50.node = pNVar2;
  Fl_Preferences::set(&local_50,"address",local_38);
  uStack_60 = 0x1c648a;
  ~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_50);
  return pNVar2;
}

Assistant:

Fl_Preferences::ID Fl_Plugin_Manager::addPlugin(const char *name, Fl_Plugin *plugin) {
  char buf[34];
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: adding plugin named \"%s\" at 0x%p\n", name, plugin);
#endif
  Fl_Preferences pin(this, name);
  buf[0] = '@'; p2a(plugin, buf+1);
  pin.set("address", buf);
  return pin.id();
}